

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void EVdelayed_submit_func(CManager cm,void *vdelayed)

{
  CManager_conflict in_RSI;
  char *in_RDI;
  event_item *event;
  int stone_num;
  delayed_event *delayed;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  int iVar2;
  CManager_conflict cm_00;
  
  uVar1 = *(undefined4 *)&in_RSI->transports;
  cm_00 = in_RSI;
  free(in_RSI);
  iVar2 = (int)((ulong)in_RSI >> 0x20);
  IntCManager_lock((CManager)event,in_RDI,(int)((ulong)cm_00 >> 0x20));
  internal_path_submit(cm_00,iVar2,(event_item *)CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  iVar2 = (int)((ulong)cm_00 >> 0x20);
  do_local_actions((CManager_conflict)0x14dfcc);
  return_event((event_path_data)cm,(event_item *)vdelayed);
  IntCManager_unlock((CManager)event,in_RDI,iVar2);
  return;
}

Assistant:

static void
EVdelayed_submit_func(CManager cm, void* vdelayed)
{
    struct delayed_event *delayed = (struct delayed_event *)vdelayed;
    int stone_num = delayed->to_stone;
    event_item *event = delayed->event;
    free(delayed);
    CManager_lock(cm);
    internal_path_submit(cm, stone_num, event);
    do_local_actions(cm);
    return_event(cm->evp, event);
    CManager_unlock(cm);
}